

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_menu_begin_image(nk_context *ctx,char *id,nk_image img,nk_vec2 size)

{
  nk_rect bounds;
  nk_vec2 size_00;
  nk_rect header_00;
  nk_image img_00;
  nk_widget_layout_states nVar1;
  nk_bool nVar2;
  undefined8 in_RSI;
  nk_command_buffer *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 unaff_retaddr;
  nk_flags state;
  int is_clicked;
  nk_input *in;
  nk_rect header;
  nk_window *win;
  nk_command_buffer *in_00;
  nk_style_button *style;
  nk_button_behavior b;
  nk_context *in_stack_ffffffffffffffc0;
  nk_window *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  float in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffffc;
  int iVar7;
  
  style = (nk_style_button *)&stack0x00000008;
  fVar5 = (float)in_RSI;
  uVar6 = (undefined4)((ulong)in_RSI >> 0x20);
  b = NK_BUTTON_DEFAULT;
  if (((in_RDI == (nk_command_buffer *)0x0) || (*(long *)&in_RDI[0x103].use_clipping == 0)) ||
     (*(long *)(*(long *)&in_RDI[0x103].use_clipping + 0xa8) == 0)) {
    iVar7 = 0;
  }
  else {
    uVar3 = (undefined4)*(undefined8 *)&in_RDI[0x103].use_clipping;
    fVar4 = (float)((ulong)*(undefined8 *)&in_RDI[0x103].use_clipping >> 0x20);
    nVar1 = nk_widget((nk_rect *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (nVar1 == NK_WIDGET_INVALID) {
      iVar7 = 0;
    }
    else {
      if ((nVar1 == NK_WIDGET_ROM) ||
         (in_00 = in_RDI, (*(uint *)(*(long *)(CONCAT44(fVar4,uVar3) + 0xa8) + 4) & 0x1000) != 0)) {
        in_00 = (nk_command_buffer *)0x0;
      }
      bounds.y = (float)uVar3;
      bounds.x = (float)in_stack_ffffffffffffffd4;
      bounds.w = fVar4;
      bounds.h = fVar5;
      img_00._4_8_ = in_XMM0_Qa;
      img_00.handle.id = (int)in_stack_fffffffffffffff0;
      img_00.region[0] = (short)in_stack_fffffffffffffffc;
      img_00.region[1] = (short)((uint)in_stack_fffffffffffffffc >> 0x10);
      img_00._16_8_ = unaff_retaddr;
      nVar2 = nk_do_button_image(&in_stack_ffffffffffffffc8->seq,in_00,bounds,img_00,b,style,
                                 (nk_input *)in_00);
      if (nVar2 != 0) {
        b = NK_BUTTON_REPEATER;
      }
      header_00._4_8_ = in_RDI;
      header_00.x = (float)uVar6;
      header_00.h = in_stack_fffffffffffffff0;
      size_00.y = fVar5;
      size_00.x = fVar4;
      iVar7 = nk_menu_begin((nk_context *)
                            CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8,(char *)in_00,b,header_00,size_00);
    }
  }
  return iVar7;
}

Assistant:

NK_API nk_bool
nk_menu_begin_image(struct nk_context *ctx, const char *id, struct nk_image img,
struct nk_vec2 size)
{
struct nk_window *win;
struct nk_rect header;
const struct nk_input *in;
int is_clicked = nk_false;
nk_flags state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
state = nk_widget(&header, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_image(&ctx->last_widget_state, &win->buffer, header,
img, NK_BUTTON_DEFAULT, &ctx->style.menu_button, in))
is_clicked = nk_true;
return nk_menu_begin(ctx, win, id, is_clicked, header, size);
}